

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitScopeList
          (ByteCodeGenerator *this,ParseNode *pnode,ParseNode *breakOnBodyScopeNode)

{
  FuncInfo *this_00;
  code *pcVar1;
  bool bVar2;
  ScriptContext *_scriptContext;
  ParseNodeFnc *pPVar3;
  undefined8 uVar4;
  ParseNodeFnc *pPVar5;
  Scope *pSVar6;
  Scope *pSVar7;
  ParseNodeBlock *pnodeBlock_00;
  ParseNodeCatch *pnodeCatch_00;
  ParseNodeWith *pPVar8;
  undefined4 *puVar9;
  ParseNodeCatch *pnodeCatch;
  ParseNodeBlock *pnodeBlock;
  Scope *paramScope;
  FuncInfo *funcInfo;
  ExclusiveContext context;
  ParseNode *breakOnBodyScopeNode_local;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  context.scriptContext = (ScriptContext *)breakOnBodyScopeNode;
  breakOnBodyScopeNode_local = pnode;
LAB_00b3b3bc:
  do {
    if ((breakOnBodyScopeNode_local == (ParseNode *)0x0) ||
       ((context.scriptContext != (ScriptContext *)0x0 &&
        (context.scriptContext == (ScriptContext *)breakOnBodyScopeNode_local)))) {
      return;
    }
    switch(breakOnBodyScopeNode_local->nop) {
    case knopFncDecl:
      pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
      bVar2 = ParseNodeFnc::GetAsmjsMode(pPVar5);
      if (bVar2) {
        _scriptContext = GetScriptContext(this);
        Js::ExclusiveContext::ExclusiveContext((ExclusiveContext *)&funcInfo,this,_scriptContext);
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        pPVar3 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        bVar2 = Js::AsmJSCompiler::Compile
                          ((ExclusiveContext *)&funcInfo,&pPVar5->super_ParseNode,
                           pPVar3->pnodeParams);
        if (!bVar2) {
          if ((DAT_01e9e239 & 1) != 0) {
            PAL_exit(-0x7ff5ebe4);
          }
          uVar4 = __cxa_allocate_exception(1);
          __cxa_throw(uVar4,&Js::AsmJsParseException::typeinfo,0);
        }
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        breakOnBodyScopeNode_local = pPVar5->pnodeNext;
        break;
      }
    case knopProg:
      pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
      if (pPVar5->funcInfo != (FuncInfo *)0x0) {
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        this_00 = pPVar5->funcInfo;
        pSVar6 = FuncInfo::GetParamScope(this_00);
        bVar2 = FuncInfo::IsBodyAndParamScopeMerged(this_00);
        if (bVar2) {
          pSVar6 = FuncInfo::GetBodyScope(this_00);
          FuncInfo::SetCurrentChildScope(this_00,pSVar6);
        }
        else {
          FuncInfo::SetCurrentChildScope(this_00,pSVar6);
        }
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        StartEmitFunction(this,pPVar5);
        bVar2 = FuncInfo::IsBodyAndParamScopeMerged(this_00);
        if (bVar2) {
          pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
          EmitScopeList(this,(ParseNode *)pPVar5->pnodeScopes,(ParseNode *)0x0);
        }
        else {
          pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
          EmitScopeList(this,pPVar5->pnodeBodyScope->pnodeScopes,(ParseNode *)0x0);
        }
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        EmitOneFunction(this,pPVar5);
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        EndEmitFunction(this,pPVar5);
        pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
        if ((pPVar5->pnodeBody != (ParseNodePtr)0x0) &&
           ((*(uint *)&this_00->field_0xb4 >> 0x10 & 1) == 0)) {
          pSVar6 = FuncInfo::GetCurrentChildScope(this_00);
          pSVar7 = FuncInfo::GetBodyScope(this_00);
          if (pSVar6 != pSVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0xd6f,
                               "(pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope())"
                               ,
                               "pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
        }
        FuncInfo::SetCurrentChildScope(this_00,(Scope *)0x0);
      }
      pPVar5 = ParseNode::AsParseNodeFnc(breakOnBodyScopeNode_local);
      breakOnBodyScopeNode_local = pPVar5->pnodeNext;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xd90,"(false)","Unexpected opcode in tree of scopes");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      break;
    case knopBlock:
      pnodeBlock_00 = ParseNode::AsParseNodeBlock(breakOnBodyScopeNode_local);
      StartEmitBlock(this,pnodeBlock_00);
      EmitScopeList(this,pnodeBlock_00->pnodeScopes,(ParseNode *)0x0);
      EndEmitBlock(this,pnodeBlock_00);
      breakOnBodyScopeNode_local = pnodeBlock_00->pnodeNext;
      break;
    case knopWith:
      StartEmitWith(this,breakOnBodyScopeNode_local);
      pPVar8 = ParseNode::AsParseNodeWith(breakOnBodyScopeNode_local);
      EmitScopeList(this,pPVar8->pnodeScopes,(ParseNode *)0x0);
      EndEmitWith(this,breakOnBodyScopeNode_local);
      pPVar8 = ParseNode::AsParseNodeWith(breakOnBodyScopeNode_local);
      breakOnBodyScopeNode_local = pPVar8->pnodeNext;
      break;
    case knopCatch:
      goto switchD_00b3b408_caseD_6a;
    }
  } while( true );
switchD_00b3b408_caseD_6a:
  pnodeCatch_00 = ParseNode::AsParseNodeCatch(breakOnBodyScopeNode_local);
  StartEmitCatch(this,pnodeCatch_00);
  EmitScopeList(this,pnodeCatch_00->pnodeScopes,(ParseNode *)0x0);
  EndEmitCatch(this,pnodeCatch_00);
  breakOnBodyScopeNode_local = pnodeCatch_00->pnodeNext;
  goto LAB_00b3b3bc;
}

Assistant:

void ByteCodeGenerator::EmitScopeList(ParseNode *pnode, ParseNode *breakOnBodyScopeNode)
{
    while (pnode)
    {
        if (breakOnBodyScopeNode != nullptr && breakOnBodyScopeNode == pnode)
        {
            break;
        }

        switch (pnode->nop)
        {
        case knopFncDecl:
#ifdef ASMJS_PLAT
            if (pnode->AsParseNodeFnc()->GetAsmjsMode())
            {
                Js::ExclusiveContext context(this, GetScriptContext());
                if (Js::AsmJSCompiler::Compile(&context, pnode->AsParseNodeFnc(), pnode->AsParseNodeFnc()->pnodeParams))
                {
                    pnode = pnode->AsParseNodeFnc()->pnodeNext;
                    break;
                }
                else if (CONFIG_FLAG(AsmJsStopOnError))
                {
                    exit(JSERR_AsmJsCompileError);
                }
                else
                {
                    // If deferral is not allowed, throw and reparse everything with asm.js disabled.
                    throw Js::AsmJsParseException();
                }
            }
#endif
            // FALLTHROUGH
        case knopProg:
            if (pnode->AsParseNodeFnc()->funcInfo)
            {
                FuncInfo* funcInfo = pnode->AsParseNodeFnc()->funcInfo;
                Scope* paramScope = funcInfo->GetParamScope();

                if (!funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->SetCurrentChildScope(paramScope);
                }
                else
                {
                    funcInfo->SetCurrentChildScope(funcInfo->GetBodyScope());
                }
                this->StartEmitFunction(pnode->AsParseNodeFnc());

                if (!funcInfo->IsBodyAndParamScopeMerged())
                {
                    this->EmitScopeList(pnode->AsParseNodeFnc()->pnodeBodyScope->pnodeScopes);
                }
                else
                {
                    this->EmitScopeList(pnode->AsParseNodeFnc()->pnodeScopes);
                }

                this->EmitOneFunction(pnode->AsParseNodeFnc());
                this->EndEmitFunction(pnode->AsParseNodeFnc());

                Assert(pnode->AsParseNodeFnc()->pnodeBody == nullptr || funcInfo->isReused || funcInfo->GetCurrentChildScope() == funcInfo->GetBodyScope());
                funcInfo->SetCurrentChildScope(nullptr);
            }
            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
            this->StartEmitBlock(pnodeBlock);
            this->EmitScopeList(pnodeBlock->pnodeScopes);
            this->EndEmitBlock(pnodeBlock);
            pnode = pnodeBlock->pnodeNext;
            break;
        }
        case knopCatch:
        {
            ParseNodeCatch * pnodeCatch = pnode->AsParseNodeCatch();
            this->StartEmitCatch(pnodeCatch);
            this->EmitScopeList(pnodeCatch->pnodeScopes);
            this->EndEmitCatch(pnodeCatch);
            pnode = pnodeCatch->pnodeNext;
            break;
        }

        case knopWith:
            this->StartEmitWith(pnode);
            this->EmitScopeList(pnode->AsParseNodeWith()->pnodeScopes);
            this->EndEmitWith(pnode);
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            break;
        }
    }
}